

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O1

void transition(int64_t k)

{
  pointer pBVar1;
  Btor2Line *pBVar2;
  char *__filename;
  ulong pos;
  long lVar3;
  long lVar4;
  BtorSimState update;
  BtorSimState local_48;
  
  __filename = "transition %ld";
  msg(1,"transition %ld",k);
  if (0 < num_format_lines) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      if (*(int *)((long)&(current_state.
                           super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                           super__Vector_impl_data._M_start)->type + lVar3) != 0) {
        BtorSimState::remove
                  ((BtorSimState *)
                   ((long)&(current_state.
                            super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                            super__Vector_impl_data._M_start)->type + lVar3),__filename);
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < num_format_lines);
  }
  if ((print_trace == '\0') && (print_states == '\x01')) {
    printf("#%ld\n",k);
  }
  if (states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pos = 0;
    do {
      pBVar2 = states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
               super__Vector_impl_data._M_start[pos];
      pBVar1 = next_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
               super__Vector_impl_data._M_start + pBVar2->id;
      local_48.type = pBVar1->type;
      local_48._4_4_ = *(undefined4 *)&pBVar1->field_0x4;
      local_48.field_1._0_4_ = *(undefined4 *)&pBVar1->field_1;
      local_48.field_1._4_4_ = *(undefined4 *)((long)&pBVar1->field_1 + 4);
      lVar3 = pBVar2->id;
      msg(5,"updating state %ld",lVar3);
      BtorSimState::update
                (current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar3,&local_48);
      if ((next_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
           super__Vector_impl_data._M_start[pBVar2->id].type == ARRAY) ||
         (next_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
          super__Vector_impl_data._M_start[pBVar2->id].type == BITVEC)) {
        next_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
        super__Vector_impl_data._M_start[pBVar2->id].field_1.bv_state = (BtorSimBitVector *)0x0;
      }
      else {
        die("Invalid state type");
      }
      if ((print_trace == '\0') && (print_states == '\x01')) {
        print_state_or_input(pBVar2->id,pos,k,false);
      }
      pos = pos + 1;
    } while (pos < (ulong)((long)states.
                                 super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)states.
                                 super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

static void
transition (int64_t k)
{
  msg (1, "transition %" PRId64, k);
  for (int64_t i = 0; i < num_format_lines; i++) delete_current_state (i);
  if (print_trace && print_states) printf ("#%" PRId64 "\n", k);
  for (size_t i = 0; i < states.size (); i++)
  {
    Btor2Line *state = states[i];
    assert (0 <= state->id), assert (state->id < num_format_lines);
    BtorSimState update = next_state[state->id];
    assert (update.is_set ());
    update_current_state (state->id, update);
    switch (next_state[state->id].type)
    {
      case BtorSimState::Type::BITVEC:
        next_state[state->id].bv_state = nullptr;
        break;
      case BtorSimState::Type::ARRAY:
        next_state[state->id].array_state = nullptr;
        break;
      default: die ("Invalid state type");
    }
    if (print_trace && print_states)
      print_state_or_input (state->id, i, k, false);
  }
}